

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O0

uint reference_ceillog2(uint x)

{
  uint local_14;
  int local_10;
  uint n;
  uint log_floor;
  uint x_local;
  
  local_10 = 0;
  for (local_14 = x; local_14 != 0; local_14 = local_14 >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10 + -1 + (uint)((x & x - 1) != 0);
}

Assistant:

unsigned int reference_ceillog2(unsigned int x) {
    unsigned int log_floor = 0;
    unsigned int n = x;
    for (;n != 0; n >>= 1)
    {
        ++log_floor;
    }
    --log_floor;
    // add one if not power of 2
    return log_floor + (((x&(x-1)) != 0) ? 1 : 0);
}